

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArray.h
# Opt level: O0

shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
FIX::shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator=(shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *rhs)

{
  shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rhs_local;
  shared_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (rhs != this) {
    attach(rhs);
    release(this);
    this->m_size = rhs->m_size;
    this->m_buffer = rhs->m_buffer;
  }
  return this;
}

Assistant:

shared_array &operator=(const shared_array &rhs) {
    if (&rhs == this) {
      return *this;
    }

    rhs.attach();
    release();

    m_size = rhs.m_size;
    m_buffer = rhs.m_buffer;

    return *this;
  }